

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

bitboards * FENboardToBitboards(bitboards *__return_storage_ptr__,char *board,int length)

{
  char cVar1;
  int local_68;
  int k;
  int blanks;
  int i;
  int j;
  char array [64];
  int length_local;
  char *board_local;
  
  blanks = 0;
  array._60_4_ = length;
  for (k = 0; k < (int)array._60_4_; k = k + 1) {
    if (board[k] != '/') {
      if ((board[k] + -0x31 < 0) || (0 < board[k] + -0x38)) {
        *(char *)((long)&i + (long)blanks) = board[k];
        blanks = blanks + 1;
      }
      else {
        cVar1 = board[k];
        for (local_68 = blanks; local_68 < blanks + cVar1 + -0x30; local_68 = local_68 + 1) {
          *(undefined1 *)((long)&i + (long)local_68) = 0x20;
        }
        blanks = cVar1 + -0x30 + blanks;
      }
    }
  }
  bitboards::bitboards(__return_storage_ptr__);
  bitboards::standardArrayToBitboards(__return_storage_ptr__,(char *)&i);
  return __return_storage_ptr__;
}

Assistant:

bitboards FENboardToBitboards(const char* board, const int length) {
  char array[64];
  int j = 0;
  for(int i = 0; i < length; i++) {
    if(board[i] == '/')
      continue;
    if(board[i] - '1' >= 0 && board[i] - '8' <= 0) {
      int blanks = board[i] - '0';
      for(int k = j; k < j + blanks; k++)
      {
        array[k] = ' ';
      }
      j += blanks;
    }
    else {
      array[j] = board[i];
      j++;
    }
  }

  bitboards returnBoards;
  returnBoards.standardArrayToBitboards(array);
  return returnBoards;
}